

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

void CVmObjBigNum::compute_diff(vm_val_t *result,char *ext1,char *ext2)

{
  char *result_00;
  
  result_00 = compute_init_2op(result,ext1,ext2);
  if (result_00 != (char *)0x0) {
    compute_diff_into(result_00,ext1,ext2);
    return;
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_diff(VMG_ vm_val_t *result,
                                const char *ext1, const char *ext2)
{
    /* allocate our result value */
    char *new_ext = compute_init_2op(vmg_ result, ext1, ext2);

    /* we're done if we had a non-number operand */
    if (new_ext == 0)
        return;

    /* compute the difference into the result object */
    compute_diff_into(new_ext, ext1, ext2);
}